

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O3

bool __thiscall BamTools::BamAlignment::GetArrayTagType(BamAlignment *this,string *tag,char *type)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  uint uVar4;
  char *pTagData;
  uint numBytesParsed;
  uint tagDataLength;
  byte *local_18;
  uint local_10;
  uint local_c;
  
  if (((this->SupportData).HasCoreOnly != false) ||
     (sVar2 = (this->TagData)._M_string_length, sVar2 == 0)) {
    return false;
  }
  local_18 = (byte *)(this->TagData)._M_dataplus._M_p;
  local_c = (uint)sVar2;
  local_10 = 0;
  bVar3 = FindTag(this,tag,(char **)&local_18,&local_c,&local_10);
  if ((bVar3) && (bVar1 = local_18[-1], *type = bVar1, bVar1 == 0x42)) {
    uVar4 = *local_18 - 0x43;
    if (0x30 < uVar4) {
      return false;
    }
    if ((0x1004900010041U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      return false;
    }
    *type = *local_18;
    return true;
  }
  return false;
}

Assistant:

bool BamAlignment::GetArrayTagType(const std::string& tag, char& type) const
{

    // skip if alignment is core-only
    if (SupportData.HasCoreOnly) {
        // TODO: set error string?
        return false;
    }

    // skip if no tags present
    if (TagData.empty()) {
        // TODO: set error string?
        return false;
    }

    // localize the tag data
    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;

    // if tag not found, return failure
    if (!FindTag(tag, pTagData, tagDataLength, numBytesParsed)) {
        // TODO: set error string?
        return false;
    }

    // check that tag type code is array
    type = *(pTagData - 1);
    if (type != Constants::BAM_TAG_TYPE_ARRAY) {
        // TODO: set error string
        return false;
    }

    // fetch element type
    const char elementType = *pTagData;
    switch (elementType) {

        // allowable types
        case (Constants::BAM_TAG_TYPE_INT8):
        case (Constants::BAM_TAG_TYPE_UINT8):
        case (Constants::BAM_TAG_TYPE_INT16):
        case (Constants::BAM_TAG_TYPE_UINT16):
        case (Constants::BAM_TAG_TYPE_INT32):
        case (Constants::BAM_TAG_TYPE_UINT32):
        case (Constants::BAM_TAG_TYPE_FLOAT):
            type = elementType;
            break;

        default:
            //TODO: set error string
            return false;
    }

    // if we get here, return success
    return true;
}